

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O0

bool __thiscall
Diligent::anon_unknown_25::ArchiveSerializer<(Diligent::SerializerMode)1>::SerializeShaders
          (ArchiveSerializer<(Diligent::SerializerMode)1> *this,ConstQual<ShadersVector> *Shaders)

{
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *this_00;
  bool bVar1;
  size_type sVar2;
  reference Data;
  SerializedData *Shader;
  const_iterator __end0;
  const_iterator __begin0;
  ConstQual<ShadersVector> *__range2;
  ConstQual<ShadersVector> *pCStack_20;
  Uint32 NumShaders;
  ConstQual<ShadersVector> *Shaders_local;
  ArchiveSerializer<(Diligent::SerializerMode)1> *this_local;
  
  pCStack_20 = Shaders;
  Shaders_local = (ConstQual<ShadersVector> *)this;
  sVar2 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::size
                    (Shaders);
  __range2._4_4_ = (undefined4)sVar2;
  bVar1 = Serializer<(Diligent::SerializerMode)1>::operator()
                    (this->Ser,(uint *)((long)&__range2 + 4));
  this_00 = pCStack_20;
  if (bVar1) {
    __end0 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::begin
                       (pCStack_20);
    Shader = (SerializedData *)
             std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::end
                       (this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_Diligent::SerializedData_*,_std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>_>
                                       *)&Shader), bVar1) {
      Data = __gnu_cxx::
             __normal_iterator<const_Diligent::SerializedData_*,_std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>_>
             ::operator*(&__end0);
      bVar1 = Serializer<(Diligent::SerializerMode)1>::Serialize(this->Ser,Data);
      if (!bVar1) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_Diligent::SerializedData_*,_std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>_>
      ::operator++(&__end0);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ArchiveSerializer<Mode>::SerializeShaders(ConstQual<ShadersVector>& Shaders) const
{
    static_assert(Mode == SerializerMode::Measure || Mode == SerializerMode::Write, "Measure or Write mode is expected.");

    Uint32 NumShaders = static_cast<Uint32>(Shaders.size());
    if (!Ser(NumShaders))
        return false;

    for (const auto& Shader : Shaders)
    {
        if (!Ser.Serialize(Shader))
            return false;
    }

    return true;
}